

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O1

nghttp2_ssize nghttp2_session_mem_send2(nghttp2_session *session,uint8_t **data_ptr)

{
  int iVar1;
  nghttp2_ssize nVar2;
  
  *data_ptr = (uint8_t *)0x0;
  nVar2 = nghttp2_session_mem_send_internal(session,data_ptr,1);
  if ((0 < nVar2) && ((session->aob).item != (nghttp2_outbound_item *)0x0)) {
    iVar1 = session_after_frame_sent1(session);
    if (iVar1 < 0) {
      if (-0x385 < iVar1) {
        __assert_fail("nghttp2_is_fatal(rv)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/nghttp2_session.c"
                      ,0xde4,
                      "nghttp2_ssize nghttp2_session_mem_send2(nghttp2_session *, const uint8_t **)"
                     );
      }
      nVar2 = (nghttp2_ssize)iVar1;
    }
  }
  return nVar2;
}

Assistant:

nghttp2_ssize nghttp2_session_mem_send2(nghttp2_session *session,
                                        const uint8_t **data_ptr) {
  int rv;
  nghttp2_ssize len;

  *data_ptr = NULL;

  len = nghttp2_session_mem_send_internal(session, data_ptr, 1);
  if (len <= 0) {
    return len;
  }

  if (session->aob.item) {
    /* We have to call session_after_frame_sent1 here to handle stream
       closure upon transmission of frames.  Otherwise, END_STREAM may
       be reached to client before we call nghttp2_session_mem_send
       again and we may get exceeding number of incoming streams. */
    rv = session_after_frame_sent1(session);
    if (rv < 0) {
      assert(nghttp2_is_fatal(rv));
      return (nghttp2_ssize)rv;
    }
  }

  return len;
}